

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_2> __thiscall
tcu::refract<double,2>(tcu *this,Vector<double,_2> *i,Vector<double,_2> *n,double eta)

{
  double dVar1;
  double a;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  Vector<double,_2> VVar4;
  Vector<double,_2> VVar5;
  Vector<double,_2> local_58;
  Vector<double,_2> local_48;
  double local_38;
  double k;
  double cosAngle;
  double eta_local;
  Vector<double,_2> *n_local;
  Vector<double,_2> *i_local;
  
  cosAngle = eta;
  eta_local = (double)n;
  n_local = i;
  i_local = (Vector<double,_2> *)this;
  k = dot<double,2>(n,i);
  dVar3 = 1.0;
  local_38 = -(cosAngle * cosAngle) * (-k * k + 1.0) + 1.0;
  if (0.0 <= local_38) {
    operator*((tcu *)&local_48,n_local,cosAngle);
    a = eta_local;
    dVar1 = cosAngle;
    dVar3 = k;
    dVar2 = ::sqrt(local_38);
    operator*((tcu *)&local_58,(Vector<double,_2> *)a,dVar1 * dVar3 + dVar2);
    VVar4 = operator-(this,&local_48,&local_58);
  }
  else {
    Vector<double,_2>::Vector((Vector<double,_2> *)this,0.0);
    VVar4.m_data[1] = dVar3;
    VVar4.m_data[0] = extraout_XMM0_Qa;
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  VVar5.m_data[1] = VVar4.m_data[1];
  return (Vector<double,_2>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}